

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

_Bool victim_tlb_hit(CPUArchState_conflict30 *env,size_t mmu_idx,size_t index,size_t elt_ofs,
                    target_ulong_conflict page)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  target_ulong_conflict *ptVar23;
  CPUIOTLBEntry tmpio;
  CPUTLBEntry tmptlb;
  
  lVar22 = mmu_idx * 0x2b0;
  ptVar23 = (target_ulong_conflict *)((long)env + lVar22 + elt_ofs + -0x828);
  lVar20 = -0x20a;
  uVar19 = 0;
  do {
    if (uVar19 == 8) {
LAB_00b2fecd:
      return uVar19 < 8;
    }
    if (*ptVar23 == page) {
      lVar3 = *(long *)(env->gpr_a + mmu_idx * 4 + -0xe);
      lVar21 = index * 0x40;
      uVar4 = *(undefined8 *)(lVar3 + lVar21);
      uVar5 = ((undefined8 *)(lVar3 + lVar21))[1];
      puVar1 = (undefined8 *)(lVar3 + lVar21 + 0x10);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)(lVar3 + lVar21 + 0x20);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)(lVar3 + lVar21 + 0x30);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      uVar12 = *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20);
      uVar13 = *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20 + 2);
      uVar14 = *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20 + 4);
      uVar15 = *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20 + 4 + 2);
      uVar16 = *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20 + 8);
      uVar17 = *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20 + 8 + 2);
      uVar18 = *(undefined8 *)(env->gpr_d + mmu_idx * 0xac + lVar20 + -4 + 2);
      puVar1 = (undefined8 *)(lVar3 + lVar21 + 0x30);
      *puVar1 = *(undefined8 *)(env->gpr_d + mmu_idx * 0xac + lVar20 + -4);
      puVar1[1] = uVar18;
      puVar1 = (undefined8 *)(lVar3 + lVar21 + 0x20);
      *puVar1 = uVar16;
      puVar1[1] = uVar17;
      puVar1 = (undefined8 *)(lVar3 + lVar21 + 0x10);
      *puVar1 = uVar14;
      puVar1[1] = uVar15;
      *(undefined8 *)(lVar3 + lVar21) = uVar12;
      ((undefined8 *)(lVar3 + lVar21))[1] = uVar13;
      *(undefined8 *)(env->gpr_d + mmu_idx * 0xac + lVar20 + -4) = uVar10;
      *(undefined8 *)(env->gpr_d + mmu_idx * 0xac + lVar20 + -4 + 2) = uVar11;
      *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20 + 8) = uVar8;
      *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20 + 8 + 2) = uVar9;
      *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20 + 4) = uVar6;
      *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20 + 4 + 2) = uVar7;
      *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20) = uVar4;
      *(undefined8 *)(env->gpr_a + mmu_idx * 0xac + lVar20 + 2) = uVar5;
      lVar3 = *(long *)((long)env + lVar22 + -0x5a8);
      puVar1 = (undefined8 *)(lVar3 + index * 0x10);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)env + lVar20 + -0x41e + lVar22);
      uVar6 = puVar2[1];
      puVar1 = (undefined8 *)(lVar3 + index * 0x10);
      *puVar1 = *puVar2;
      puVar1[1] = uVar6;
      puVar1 = (undefined8 *)((long)env + lVar20 + -0x41e + lVar22);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      goto LAB_00b2fecd;
    }
    uVar19 = uVar19 + 1;
    lVar20 = lVar20 + 0x10;
    ptVar23 = ptVar23 + 0x10;
  } while( true );
}

Assistant:

static bool victim_tlb_hit(CPUArchState *env, size_t mmu_idx, size_t index,
                           size_t elt_ofs, target_ulong page)
{
    size_t vidx;

    // assert_cpu_is_self(env_cpu(env));
    for (vidx = 0; vidx < CPU_VTLB_SIZE; ++vidx) {
        CPUTLBEntry *vtlb = &env_tlb(env)->d[mmu_idx].vtable[vidx];
        target_ulong cmp;

#if TCG_OVERSIZED_GUEST
        cmp = *(target_ulong *)((uintptr_t)vtlb + elt_ofs);
#else
        cmp = *(target_ulong *)((uintptr_t)vtlb + elt_ofs);
#endif

        if (cmp == page) {
            /* Found entry in victim tlb, swap tlb and iotlb.  */
            CPUTLBEntry tmptlb, *tlb = &env_tlb(env)->f[mmu_idx].table[index];

            copy_tlb_helper_locked(&tmptlb, tlb);
            copy_tlb_helper_locked(tlb, vtlb);
            copy_tlb_helper_locked(vtlb, &tmptlb);

            CPUIOTLBEntry tmpio, *io = &env_tlb(env)->d[mmu_idx].iotlb[index];
            CPUIOTLBEntry *vio = &env_tlb(env)->d[mmu_idx].viotlb[vidx];
            tmpio = *io; *io = *vio; *vio = tmpio;
            return true;
        }
    }
    return false;
}